

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::LaunchHelper::LaunchHelper(LaunchHelper *this,cmCTestBuildHandler *handler)

{
  string *source;
  cmCTest *this_00;
  cmCTestBuildHandler *pcVar1;
  byte bVar2;
  string launchEnv;
  string tag;
  string local_e0;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  this->Handler = handler;
  this_00 = (handler->super_cmCTestGenericHandler).CTest;
  this->CTest = this_00;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_a0,this_00);
  pcVar1 = this->Handler;
  if (local_a0._M_string_length == 0) {
    pcVar1->UseCTestLaunch = false;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_(&local_c0,this->CTest);
    local_50.View_._M_len = local_c0._M_string_length;
    local_50.View_._M_str = local_c0._M_dataplus._M_p;
    local_80.View_._M_len = 9;
    local_80.View_._M_str = "/Testing/";
    cmStrCat<std::__cxx11::string,char[7]>
              (&local_e0,&local_50,&local_80,&local_a0,(char (*) [7])"/Build");
    source = &pcVar1->CTestLaunchDir;
    std::__cxx11::string::operator=((string *)source,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    cmsys::SystemTools::RemoveADirectory(source);
    bVar2 = this->Handler->UseCTestLaunch;
    if ((bool)bVar2 == true) {
      cmsys::SystemTools::MakeDirectory(source,(mode_t *)0x0);
      WriteLauncherConfig(this);
      local_50.View_._M_len = 0x12;
      local_50.View_._M_str = "CTEST_LAUNCH_LOGS=";
      local_80.View_._M_str = (pcVar1->CTestLaunchDir)._M_dataplus._M_p;
      local_80.View_._M_len = (pcVar1->CTestLaunchDir)._M_string_length;
      cmStrCat<>(&local_e0,&local_50,&local_80);
      cmsys::SystemTools::PutEnv(&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      bVar2 = this->Handler->UseCTestLaunch;
    }
    if ((bVar2 & 1) != 0) goto LAB_00458876;
  }
  cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
LAB_00458876:
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

cmCTestBuildHandler::LaunchHelper::LaunchHelper(cmCTestBuildHandler* handler)
  : Handler(handler)
  , CTest(handler->CTest)
{
  std::string tag = this->CTest->GetCurrentTag();
  if (tag.empty()) {
    // This is not for a dashboard submission, so there is no XML.
    // Skip enabling the launchers.
    this->Handler->UseCTestLaunch = false;
  } else {
    // Compute a directory in which to store launcher fragments.
    std::string& launchDir = this->Handler->CTestLaunchDir;
    launchDir =
      cmStrCat(this->CTest->GetBinaryDir(), "/Testing/", tag, "/Build");

    // Clean out any existing launcher fragments.
    cmSystemTools::RemoveADirectory(launchDir);

    if (this->Handler->UseCTestLaunch) {
      // Enable launcher fragments.
      cmSystemTools::MakeDirectory(launchDir);
      this->WriteLauncherConfig();
      std::string launchEnv = cmStrCat("CTEST_LAUNCH_LOGS=", launchDir);
      cmSystemTools::PutEnv(launchEnv);
    }
  }

  // If not using launchers, make sure they passthru.
  if (!this->Handler->UseCTestLaunch) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
}